

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigCone.c
# Opt level: O3

void Saig_ManPrintCones(Aig_Man_t *p)

{
  long lVar1;
  
  puts("The format of this print-out: For each PO, x:a b=c+d+e, where ");
  puts("- x is the time-frame counting back from the PO");
  puts("- a is the total number of registers in the COI of the PO so far");
  puts("- b is the number of registers in the COI of the PO in this time-frame");
  puts("- c is the number of registers in b that are new (appear for the first time)");
  puts("- d is the number of registers in b in common with the previous time-frame");
  puts("- e is the number of registers in b in common with other time-frames");
  Aig_ManSetCioIds(p);
  if (0 < p->nTruePos) {
    lVar1 = 0;
    do {
      if (p->vCos->nSize <= lVar1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Saig_ManPrintConeOne(p,(Aig_Obj_t *)p->vCos->pArray[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < p->nTruePos);
  }
  return;
}

Assistant:

void Saig_ManPrintCones( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    printf( "The format of this print-out: For each PO, x:a b=c+d+e, where \n" );
    printf( "- x is the time-frame counting back from the PO\n" );
    printf( "- a is the total number of registers in the COI of the PO so far\n" );
    printf( "- b is the number of registers in the COI of the PO in this time-frame\n" );
    printf( "- c is the number of registers in b that are new (appear for the first time)\n" );
    printf( "- d is the number of registers in b in common with the previous time-frame\n" );
    printf( "- e is the number of registers in b in common with other time-frames\n" );
    Aig_ManSetCioIds( p );
    Saig_ManForEachPo( p, pObj, i )
        Saig_ManPrintConeOne( p, pObj );
}